

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt_solver_basis.cc
# Opt level: O0

void __thiscall ipx::KKTSolverBasis::DropDual(KKTSolverBasis *this,Iterate *iterate,Info *info)

{
  double dVar1;
  bool bVar2;
  BasicStatus BVar3;
  Int IVar4;
  double *pdVar5;
  reference pvVar6;
  IndexedVector *pIVar7;
  long in_RDX;
  Iterate *in_RSI;
  int __x;
  long in_RDI;
  double extraout_XMM0_Qa;
  IndexedVector *extraout_XMM0_Qa_00;
  pointer piVar8;
  bool exchanged;
  Int jb;
  double pivot;
  anon_class_32_4_f929d714 search_pivot;
  double vmax;
  Int pmax;
  double s;
  Int jn_1;
  Int j;
  Int p;
  Vector invscale_basic;
  double zj;
  double xj;
  Int jn;
  vector<int,_std::allocator<int>_> candidates;
  double volume_tol;
  double drop_dual;
  IndexedVector ftran;
  Vector *zu;
  Vector *zl;
  Vector *xu;
  Vector *xl;
  Int n;
  Int m;
  undefined4 in_stack_fffffffffffffdd8;
  Int in_stack_fffffffffffffddc;
  Iterate *in_stack_fffffffffffffde0;
  Basis *in_stack_fffffffffffffde8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdf0;
  double *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe08;
  IndexedVector *in_stack_fffffffffffffe10;
  Basis *in_stack_fffffffffffffe18;
  IndexedVector *in_stack_fffffffffffffe20;
  IndexedVector *in_stack_fffffffffffffe30;
  Basis *in_stack_fffffffffffffe40;
  byte local_14d;
  string local_148 [32];
  double local_128;
  valarray<double> *local_120;
  double *local_118;
  undefined8 *local_110;
  int *local_108;
  undefined8 local_100;
  int local_f4;
  double local_f0;
  int local_e4;
  Int local_e0;
  int local_dc;
  valarray<double> local_d8;
  undefined4 local_c4;
  double local_c0;
  double local_b8;
  int local_ac;
  undefined8 local_90;
  double local_78;
  undefined1 local_70 [48];
  Vector *local_40;
  Vector *local_38;
  Vector *local_30;
  Vector *local_28;
  Int local_20;
  Int local_1c;
  long local_18;
  Iterate *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = Model::rows(*(Model **)(in_RDI + 0x10));
  local_20 = Model::cols(*(Model **)(in_RDI + 0x10));
  local_28 = Iterate::xl(local_10);
  local_30 = Iterate::xu(local_10);
  local_38 = Iterate::zl(local_10);
  local_40 = Iterate::zu(local_10);
  IndexedVector::IndexedVector
            (in_stack_fffffffffffffe10,(Int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  local_78 = Control::ipm_drop_dual(*(Control **)(in_RDI + 8));
  local_90 = 0x4000000000000000;
  *(undefined4 *)(local_18 + 0xc) = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x832c8c);
  for (local_ac = 0; local_ac < local_20 + local_1c; local_ac = local_ac + 1) {
    BVar3 = Basis::StatusOf(in_stack_fffffffffffffde8,
                            (Int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
    if (BVar3 == NONBASIC) {
      pdVar5 = std::valarray<double>::operator[](local_38,(long)local_ac);
      dVar1 = *pdVar5;
      pdVar5 = std::valarray<double>::operator[](local_40,(long)local_ac);
      if (dVar1 < *pdVar5) {
        pdVar5 = std::valarray<double>::operator[](local_30,(long)local_ac);
        local_b8 = *pdVar5;
        pdVar5 = std::valarray<double>::operator[](local_40,(long)local_ac);
        local_c0 = *pdVar5;
      }
      else {
        pdVar5 = std::valarray<double>::operator[](local_28,(long)local_ac);
        local_b8 = *pdVar5;
        pdVar5 = std::valarray<double>::operator[](local_38,(long)local_ac);
        local_c0 = *pdVar5;
      }
      if ((local_c0 < local_b8 * 0.01) && (local_c0 <= local_78)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_fffffffffffffdf0,(value_type_conflict2 *)in_stack_fffffffffffffde8);
      }
    }
  }
  bVar2 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffdf0);
  if (bVar2) {
    local_c4 = 1;
  }
  else {
    std::valarray<double>::valarray
              ((valarray<double> *)in_stack_fffffffffffffde0,
               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    for (local_dc = 0; local_dc < local_1c; local_dc = local_dc + 1) {
      local_e0 = Basis::operator[]((Basis *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      pdVar5 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x228),(long)local_e0);
      in_stack_fffffffffffffe40 = (Basis *)(1.0 / *pdVar5);
      pdVar5 = std::valarray<double>::operator[](&local_d8,(long)local_dc);
      *pdVar5 = (double)in_stack_fffffffffffffe40;
    }
LAB_00832fdf:
    bVar2 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffdf0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_c4 = 0;
    }
    else {
      pvVar6 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0);
      local_e4 = *pvVar6;
      pdVar5 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x228),(long)local_e4);
      local_f0 = *pdVar5;
      Basis::SolveForUpdate
                (in_stack_fffffffffffffe40,(Int)((ulong)pdVar5 >> 0x20),in_stack_fffffffffffffe30);
      local_f4 = -1;
      local_100 = 0x4000000000000000;
      local_120 = &local_d8;
      local_118 = &local_f0;
      local_110 = &local_100;
      local_108 = &local_f4;
      for_each_nonzero<ipx::KKTSolverBasis::DropDual(ipx::Iterate*,ipx::Info*)::__0>
                (in_stack_fffffffffffffe20,(anon_class_32_4_f929d714 *)in_stack_fffffffffffffe18);
      if (local_f4 < 0) {
        Iterate::make_fixed(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
        Basis::FixNonbasicVariable((Basis *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
        in_stack_fffffffffffffde0 =
             (Iterate *)
             std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x228),(long)local_e4);
        in_stack_fffffffffffffde0->model_ = (Model *)0x0;
        *(int *)(local_18 + 0x4c) = *(int *)(local_18 + 0x4c) + 1;
        goto LAB_008333ab;
      }
      __x = (int)local_70;
      in_stack_fffffffffffffe30 =
           (IndexedVector *)
           IndexedVector::operator[]
                     ((IndexedVector *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      local_128 = (double)(in_stack_fffffffffffffe30->elements_)._M_size;
      std::abs(__x);
      if (extraout_XMM0_Qa < 0.001) {
        pIVar7 = (IndexedVector *)Control::Debug(*(Control **)(in_RDI + 8),3);
        in_stack_fffffffffffffe20 = pIVar7;
        in_stack_fffffffffffffe18 = (Basis *)std::operator<<((ostream *)pIVar7," |pivot| = ");
        std::abs((int)pIVar7);
        in_stack_fffffffffffffe10 = extraout_XMM0_Qa_00;
        sci2_abi_cxx11_((double)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        in_stack_fffffffffffffe08 = std::operator<<((ostream *)in_stack_fffffffffffffe18,local_148);
        std::operator<<(in_stack_fffffffffffffe08," (dual nonbasic variable close to zero)\n");
        std::__cxx11::string::~string(local_148);
      }
      IVar4 = Basis::operator[]((Basis *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      IVar4 = Basis::ExchangeIfStable
                        (in_stack_fffffffffffffe18,(Int)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                         (Int)in_stack_fffffffffffffe10,(double)in_stack_fffffffffffffe08,IVar4,
                         (bool *)in_stack_fffffffffffffdf8);
      *(Int *)(local_18 + 0xc) = IVar4;
      if (*(int *)(local_18 + 0xc) == 0) goto LAB_00833293;
      local_c4 = 1;
    }
    std::valarray<double>::~valarray((valarray<double> *)in_stack_fffffffffffffde0);
  }
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffdf0);
  IndexedVector::~IndexedVector((IndexedVector *)in_stack_fffffffffffffde0);
  return;
LAB_00833293:
  if ((local_14d & 1) != 0) {
    in_stack_fffffffffffffdf8 =
         std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x228),(long)local_e4);
    piVar8 = (pointer)(1.0 / *in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffdf0 =
         (vector<int,_std::allocator<int>_> *)
         std::valarray<double>::operator[](&local_d8,(long)local_f4);
    (in_stack_fffffffffffffdf0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = piVar8;
    *(int *)(local_18 + 0xd4) = *(int *)(local_18 + 0xd4) + 1;
    *(int *)(in_RDI + 0x244) = *(int *)(in_RDI + 0x244) + 1;
LAB_008333ab:
    std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)0x8333b8);
  }
  goto LAB_00832fdf;
}

Assistant:

void KKTSolverBasis::DropDual(Iterate* iterate, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& xl = iterate->xl();
    const Vector& xu = iterate->xu();
    const Vector& zl = iterate->zl();
    const Vector& zu = iterate->zu();
    IndexedVector ftran(m);
    const double drop_dual = control_.ipm_drop_dual();
    const double volume_tol = 2.0;
    info->errflag = 0;

    std::vector<Int> candidates;
    for (Int jn = 0; jn < n+m; jn++) {
        if (basis_.StatusOf(jn) != Basis::NONBASIC)
            continue;
        assert(std::isfinite(xl[jn]) || std::isfinite(xu[jn]));
        assert(xl[jn] > 0.0);
        assert(xu[jn] > 0.0);
        assert(zl[jn] > 0.0 || zu[jn] > 0.0);
        double xj, zj;
        if (zl[jn] >= zu[jn]) { // choose larger dual variable
            xj = xl[jn];
            zj = zl[jn];
        } else {
            xj = xu[jn];
            zj = zu[jn];
        }
        if (zj < 0.01*xj && zj <= drop_dual)
            candidates.push_back(jn);
    }
    if (candidates.empty())
        return;

    // Maintain a copy of the inverse scaling factors of basic variables for
    // faster access.
    Vector invscale_basic(m);
    for (Int p = 0; p < m; p++) {
        Int j = basis_[p];
        invscale_basic[p] = 1.0 / colscale_[j];
        assert(std::isfinite(invscale_basic[p]));
        assert(invscale_basic[p] >= 0.0);
    }

    while (!candidates.empty()) {
        Int jn = candidates.back();
        // Pivot jn into the basis if volume increases sufficiently.
        const double s = colscale_[jn];
        basis_.SolveForUpdate(jn, ftran);
        Int pmax = -1;
        double vmax = volume_tol;
        auto search_pivot = [&](Int p, double pivot) {
            pivot = std::abs(pivot);
            if (pivot > kPivotZeroTol) {
                double v = pivot * invscale_basic[p] * s;
                if (v > vmax) {
                    vmax = v;
                    pmax = p;
                }
            }
        };
        for_each_nonzero(ftran, search_pivot);
        if (pmax >= 0) {
            double pivot = ftran[pmax];
            if (std::abs(pivot) < 1e-3)
                control_.Debug(3)
                    << " |pivot| = " << sci2(std::abs(pivot))
                    << " (dual nonbasic variable close to zero)\n";
            Int jb = basis_[pmax];
            // Pivot jn into the basis.
            assert(basis_.StatusOf(jb) == Basis::BASIC);
            bool exchanged;
            info->errflag = basis_.ExchangeIfStable(jb, jn, pivot, -1,
                                                    &exchanged);
            if (info->errflag)
                return;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            invscale_basic[pmax] = 1.0 / colscale_[jn];
            assert(std::isfinite(invscale_basic[pmax]));
            assert(invscale_basic[pmax] >= 0.0);
            info->updates_ipm++;
            basis_changes_++;
        } else {
            // Make variable jn "fixed" at its current value.
            iterate->make_fixed(jn);
            basis_.FixNonbasicVariable(jn);
            colscale_[jn] = 0.0;
            info->dual_dropped++;
        }
        candidates.pop_back();
    }
}